

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O0

void __thiscall
Fastzip::packZipData
          (Fastzip *this,File *f,int size,PackFormat inFormat,PackFormat outFormat,uint8_t *sha,
          ZipEntry *target)

{
  int iVar1;
  pointer puVar2;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  PackResult local_5c;
  size_t sStack_58;
  PackResult state;
  size_t startPos;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_40;
  __array outBuf;
  size_t outSize;
  uint8_t *sha_local;
  PackFormat outFormat_local;
  PackFormat inFormat_local;
  int size_local;
  File *f_local;
  Fastzip *this_local;
  
  outBuf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (long)(size + (size / 0x3fff + 1) * 5 + 0x10000);
  std::make_unique<unsigned_char[]>((size_t)&local_40);
  target->store = false;
  if (size == 0) {
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(&local_40)
    ;
    store_uncompressed(f,0,puVar2,(size_t *)&outBuf,&target->crc,sha);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&target->data,&local_40);
    target->store = true;
    target->dataSize = 0;
    startPos._0_4_ = 1;
  }
  else {
    if (inFormat == UNCOMPRESSED) {
      sStack_58 = File::tell(f);
      if (((int)outFormat < 1) || (9 < (int)outFormat)) {
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (&local_40);
        local_5c = store_uncompressed(f,size,puVar2,(size_t *)&outBuf,&target->crc,sha);
      }
      else {
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (&local_40);
        local_5c = infozip_deflate(outFormat,f,size,puVar2,(size_t *)&outBuf,&target->crc,sha);
        outBuf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
        .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             ((long)outBuf._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 7U >> 3);
      }
      if (local_5c == FAILED) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Compression failed! Storing \'",&local_c1);
        std::operator+(&local_a0,&local_c0,&target->name);
        std::operator+(&local_80,&local_a0,"\' as a fallback");
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()(&this->warning,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        File::seek(f,sStack_58,0);
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (&local_40);
        local_5c = store_uncompressed(f,size,puVar2,(size_t *)&outBuf,&target->crc,sha);
      }
      if (local_5c == STORED) {
        target->store = true;
      }
      target->originalSize = (long)size;
    }
    else {
      if (((int)inFormat < 1) || (outFormat != COMPRESSED)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"Unpacking not supported, storing \'",&local_129);
        std::operator+(&local_108,&local_128,&target->name);
        std::operator+(&local_e8,&local_108,"\' with original compression");
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()(&this->warning,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (&local_40);
        iVar1 = store_compressed(f,size,puVar2,sha);
        target->originalSize = (long)iVar1;
      }
      else {
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (&local_40);
        store_compressed(f,size,puVar2,sha);
      }
      outBuf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (long)size;
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&target->data,&local_40);
    target->dataSize =
         (uint64_t)
         outBuf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    startPos._0_4_ = 0;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

void Fastzip::packZipData(File& f, int size, PackFormat inFormat,
                          PackFormat outFormat, uint8_t* sha, ZipEntry& target)
{
    // Maximum size for deflate + space for buffer
    size_t outSize = size + (size / 16383 + 1) * 5 + 64 * 1024;
    auto outBuf = std::make_unique<uint8_t[]>(outSize);
    // auto outBuf = std::make_unique<uint8_t[]>(outSize);
    target.store = false;

    if (size == 0) {
        store_uncompressed(f, 0, outBuf.get(), &outSize, &target.crc, sha);
        target.data = std::move(outBuf);
        target.store = true;
        target.dataSize = 0;
        return;
    }

    if (inFormat == UNCOMPRESSED) {
        auto startPos = f.tell();
        PackResult state;

        if (outFormat >= ZIP1_COMPRESSED && outFormat <= ZIP9_COMPRESSED) {
            state = infozip_deflate(outFormat, f, size, outBuf.get(), &outSize,
                                    &target.crc, sha);
            outSize = (outSize + 7) >> 3;
        }
#ifdef WITH_INTEL
        else if (outFormat == INTEL_COMPRESSED)
            state = intel_deflate(f, size, outBuf.get(), &outSize, &target.crc,
                                  sha, earlyOut);
#endif
        else
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);

        if (state == PackResult::FAILED) {
            warning(string("Compression failed! Storing '") + target.name +
                    "' as a fallback");
            f.seek(startPos);
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);
        }
        if (state == PackResult::STORED)
            target.store = true;
        target.originalSize = size;
    } else if (inFormat > 0 && outFormat == COMPRESSED) {
        // Keep format, just inflate to calculate sha if necessary
        store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    } else {
        // Unpacking is not supported
        warning(string("Unpacking not supported, storing '") + target.name +
                "' with original compression");
        target.originalSize = store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    }

    target.data = std::move(outBuf);
    target.dataSize = outSize;
}